

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

bool google::protobuf::compiler::cpp::IsFileDescriptorProto(FileDescriptor *file,Options *options)

{
  undefined8 uVar1;
  bool bVar2;
  Descriptor *pDVar3;
  Options *in_RCX;
  FileDescriptor *in_RDX;
  int i;
  int index;
  bool bVar4;
  string sStack_c8;
  undefined1 local_a8 [80];
  AlphaNum local_58;
  
  Namespace_abi_cxx11_(&sStack_c8,(cpp *)file,in_RDX,in_RCX);
  local_58.piece_ = absl::lts_20240722::NullSafeStringView("::");
  bVar4 = options->opensource_runtime != false;
  uVar1._0_1_ = '\x10';
  uVar1._1_1_ = '\0';
  uVar1._2_1_ = '\0';
  uVar1._3_1_ = '\0';
  uVar1._4_1_ = '\0';
  uVar1._5_1_ = '\0';
  uVar1._6_1_ = '\0';
  uVar1._7_1_ = '\0';
  local_a8[0x20] = '\x06';
  local_a8[0x21] = '\0';
  local_a8[0x22] = '\0';
  local_a8[0x23] = '\0';
  local_a8[0x24] = '\0';
  local_a8[0x25] = '\0';
  local_a8[0x26] = '\0';
  local_a8[0x27] = '\0';
  if (bVar4) {
    local_a8._32_8_ = uVar1;
  }
  local_a8._40_8_ = "proto2";
  if (bVar4) {
    local_a8._40_8_ = "google::protobuf";
  }
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_a8,&local_58);
  bVar2 = std::operator!=(&sStack_c8,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_a8);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&sStack_c8);
  bVar4 = false;
  for (index = 0; (!bVar2 && (bVar4 = index < *(int *)(file + 0x3c), index < *(int *)(file + 0x3c)))
      ; index = index + 1) {
    pDVar3 = FileDescriptor::message_type(file,index);
    bVar2 = std::operator==(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                             (pDVar3 + 8),"FileDescriptorProto");
  }
  return bVar4;
}

Assistant:

bool IsFileDescriptorProto(const FileDescriptor* file, const Options& options) {
  if (Namespace(file, options) !=
      absl::StrCat("::", ProtobufNamespace(options))) {
    return false;
  }
  for (int i = 0; i < file->message_type_count(); ++i) {
    if (file->message_type(i)->name() == "FileDescriptorProto") return true;
  }
  return false;
}